

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_ord(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 in_RAX;
  char *pcVar1;
  int iValue;
  int nLen;
  
  nLen = (int)((ulong)in_RAX >> 0x20);
  if (0 < nArg) {
    pcVar1 = jx9_value_to_string(*apArg,&nLen);
    if (0 < nLen) {
      iValue = (int)*pcVar1;
      goto LAB_0012b948;
    }
  }
  iValue = -1;
LAB_0012b948:
  jx9_result_int(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_ord(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen, c;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the ASCII value of the first character */
	c = zString[0];
	/* Return that value */
	jx9_result_int(pCtx, c);
	return JX9_OK;
}